

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall aiCamera::aiCamera(aiCamera *this)

{
  (this->mName).length = 0;
  (this->mName).data[0] = '\0';
  memset((this->mName).data + 1,0x1b,0x3ff);
  (this->mPosition).x = 0.0;
  (this->mPosition).y = 0.0;
  *(undefined8 *)&(this->mPosition).z = 0;
  (this->mUp).y = 1.0;
  (this->mUp).z = 0.0;
  (this->mLookAt).x = 0.0;
  (this->mLookAt).y = 0.0;
  *(undefined8 *)&(this->mLookAt).z = 0x3f490fdb3f800000;
  this->mClipPlaneNear = 0.1;
  this->mClipPlaneFar = 1000.0;
  this->mAspect = 0.0;
  return;
}

Assistant:

aiCamera() AI_NO_EXCEPT
        : mUp               (0.f,1.f,0.f)
        , mLookAt           (0.f,0.f,1.f)
        , mHorizontalFOV    (0.25f * (float)AI_MATH_PI)
        , mClipPlaneNear    (0.1f)
        , mClipPlaneFar     (1000.f)
        , mAspect           (0.f)
    {}